

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DualStringMappedVector.hpp
# Opt level: O0

bool __thiscall
gmlc::containers::
DualStringMappedVector<helics::Publication,_helics::InterfaceHandle,_(reference_stability)0,_5>::
addSearchTerm(DualStringMappedVector<helics::Publication,_helics::InterfaceHandle,_(reference_stability)0,_5>
              *this,string_view searchValue,InterfaceHandle *existingValue)

{
  bool bVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__args;
  unordered_map<std::basic_string_view<char,_std::char_traits<char>_>,_unsigned_long,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_unsigned_long>_>_>
  *in_RDI;
  pair<std::__detail::_Node_iterator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_unsigned_long>,_false,_true>,_bool>
  pVar2;
  pair<std::__detail::_Node_iterator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_unsigned_long>,_false,_true>,_bool>
  res;
  iterator fnd;
  map<helics::InterfaceHandle,_unsigned_long,_std::less<helics::InterfaceHandle>,_std::allocator<std::pair<const_helics::InterfaceHandle,_unsigned_long>_>_>
  *in_stack_ffffffffffffff88;
  StableBlockVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_5U,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *this_00;
  __node_base_ptr *__args_1;
  basic_string_view<char,_std::char_traits<char>_> *in_stack_ffffffffffffffb8;
  undefined1 in_stack_ffffffffffffffc0;
  undefined7 in_stack_ffffffffffffffc1;
  _Self local_38;
  _Self local_30 [5];
  bool local_1;
  
  local_30[0]._M_node =
       (_Base_ptr)
       std::
       map<helics::InterfaceHandle,_unsigned_long,_std::less<helics::InterfaceHandle>,_std::allocator<std::pair<const_helics::InterfaceHandle,_unsigned_long>_>_>
       ::find(in_stack_ffffffffffffff88,(key_type *)0x3928d3);
  local_38._M_node =
       (_Base_ptr)
       std::
       map<helics::InterfaceHandle,_unsigned_long,_std::less<helics::InterfaceHandle>,_std::allocator<std::pair<const_helics::InterfaceHandle,_unsigned_long>_>_>
       ::end(in_stack_ffffffffffffff88);
  bVar1 = std::operator==(local_30,&local_38);
  if (((bVar1 ^ 0xffU) & 1) == 0) {
    local_1 = false;
  }
  else {
    this_00 = (StableBlockVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_5U,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&in_RDI[1]._M_h._M_single_bucket;
    StableBlockVector<std::__cxx11::string,5u,std::allocator<std::__cxx11::string>>::
    emplace_back<std::basic_string_view<char,std::char_traits<char>>&>
              ((StableBlockVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_5U,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)CONCAT71(in_stack_ffffffffffffffc1,in_stack_ffffffffffffffc0),
               in_stack_ffffffffffffffb8);
    __args_1 = &(in_RDI->_M_h)._M_single_bucket;
    __args = StableBlockVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_5U,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::back(this_00);
    std::_Rb_tree_iterator<std::pair<const_helics::InterfaceHandle,_unsigned_long>_>::operator->
              ((_Rb_tree_iterator<std::pair<const_helics::InterfaceHandle,_unsigned_long>_> *)
               0x392942);
    pVar2 = std::
            unordered_map<std::basic_string_view<char,std::char_traits<char>>,unsigned_long,std::hash<std::basic_string_view<char,std::char_traits<char>>>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,unsigned_long>>>
            ::emplace<std::__cxx11::string&,unsigned_long&>(in_RDI,__args,(unsigned_long *)__args_1)
    ;
    local_1 = (bool)(pVar2.second & 1);
  }
  return local_1;
}

Assistant:

auto addSearchTerm(
            std::string_view searchValue,
            const searchType2& existingValue)
        {
            auto fnd = lookup2.find(existingValue);
            if (fnd != lookup2.end()) {
                names.emplace_back(searchValue);
                auto res = lookup1.emplace(names.back(), fnd->second);
                return res.second;
            }
            return false;
        }